

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

void moira::sprintd_signed(char **s,i64 value)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  
  if (value < 0) {
    pcVar1 = *s;
    *s = pcVar1 + 1;
    *pcVar1 = '-';
    value = -value;
LAB_0012f12e:
    dVar4 = log10((double)value);
    uVar2 = (int)dVar4 + 1;
    uVar3 = (ulong)uVar2;
    if ((int)dVar4 < 0) goto LAB_0012f17d;
  }
  else {
    if (value != 0) goto LAB_0012f12e;
    uVar3 = 1;
    value = 0;
  }
  uVar2 = (uint)uVar3;
  uVar3 = uVar3 + 1;
  do {
    (*s)[uVar3 - 2] = (char)value + (char)((ulong)value / 10) * -10 | 0x30;
    uVar3 = uVar3 - 1;
    value = (ulong)value / 10;
  } while (1 < uVar3);
LAB_0012f17d:
  *s = *s + (int)uVar2;
  return;
}

Assistant:

static void sprintd_signed(char *&s, i64 value)
{
    if (value < 0) { *s++ = '-'; value *= -1; }
    sprintd(s, value, decDigits(value));
}